

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtsc.c
# Opt level: O0

int busy_loop_delay(int milliseconds)

{
  int iVar1;
  uint64_t local_30;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  int first;
  int r;
  int cycles;
  int milliseconds_local;
  
  first = 0;
  a._4_4_ = 0;
  a._0_4_ = 1;
  r = milliseconds;
  sys_precise_clock(&b);
  while (sys_precise_clock(&local_30), (local_30 - b) / 1000 <= (ulong)(long)r) {
    iVar1 = busy_loop(first);
    a._4_4_ = iVar1 + a._4_4_;
    if ((int)a == 0) {
      if (local_30 - c < 1000) {
        first = first << 1;
      }
      if (10000 < local_30 - c) {
        first = first / 2;
      }
    }
    else {
      a._0_4_ = 0;
    }
    c = local_30;
  }
  return a._4_4_;
}

Assistant:

int busy_loop_delay(int milliseconds)
{
	int cycles = 0, r = 0, first = 1;
	uint64_t a, b, c;
	sys_precise_clock(&a);
	while (1) {
		sys_precise_clock(&c);
		if ((c - a) / 1000 > milliseconds) return r;
		r += busy_loop(cycles);
		if (first) {
			first = 0;
		} else {
			if (c - b < 1000) cycles *= 2;
			if (c - b > 10000) cycles /= 2;
		}
		b = c;
	}
}